

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KdTree.h
# Opt level: O2

vector<Point2D,_std::allocator<Point2D>_> * __thiscall
lazyTrees::LazyKdTree<Point2D>::in_box
          (vector<Point2D,_std::allocator<Point2D>_> *__return_storage_ptr__,
          LazyKdTree<Point2D> *this,Point2D *search,Point2D *sizes)

{
  LazyKdTree<Point2D> *pLVar1;
  bool bVar2;
  Compare CVar3;
  double *pdVar4;
  size_t i;
  size_t idx;
  ulong dim;
  double dVar5;
  _Vector_base<Point2D,_std::allocator<Point2D>_> local_58;
  double local_40;
  double local_38;
  
  ensure_evaluated(this);
  idx = 0;
  while (idx != 2) {
    pdVar4 = Point2D::operator[](sizes,idx);
    idx = idx + 1;
    if (*pdVar4 <= 0.0) {
      (__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar2 = true;
  dim = 0;
  while ((dim < 2 && (bVar2))) {
    dVar5 = dimension_dist(search,(this->data)._M_t.
                                  super___uniq_ptr_impl<Point2D,_std::default_delete<Point2D>_>._M_t
                                  .super__Tuple_impl<0UL,_Point2D_*,_std::default_delete<Point2D>_>.
                                  super__Head_base<0UL,_Point2D_*,_false>._M_head_impl,dim);
    pdVar4 = Point2D::operator[](sizes,dim);
    bVar2 = dVar5 <= *pdVar4 * 0.5;
    dim = dim + 1;
  }
  if (bVar2) {
    std::vector<Point2D,_std::allocator<Point2D>_>::push_back
              (__return_storage_ptr__,
               (this->data)._M_t.super___uniq_ptr_impl<Point2D,_std::default_delete<Point2D>_>._M_t.
               super__Tuple_impl<0UL,_Point2D_*,_std::default_delete<Point2D>_>.
               super__Head_base<0UL,_Point2D_*,_false>._M_head_impl);
  }
  if ((this->childPositive)._M_t.
      super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
      .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl ==
      (LazyKdTree<Point2D> *)0x0 &&
      (this->childNegative)._M_t.
      super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
      .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl ==
      (LazyKdTree<Point2D> *)0x0) {
    return __return_storage_ptr__;
  }
  CVar3 = dimension_compare(search,(this->data)._M_t.
                                   super___uniq_ptr_impl<Point2D,_std::default_delete<Point2D>_>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_Point2D_*,_std::default_delete<Point2D>_>.
                                   super__Head_base<0UL,_Point2D_*,_false>._M_head_impl,this->dim);
  if (CVar3 == NEGATIVE) {
    pLVar1 = (this->childNegative)._M_t.
             super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
             .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl;
    if (pLVar1 == (LazyKdTree<Point2D> *)0x0) goto LAB_00145971;
    in_box((vector<Point2D,_std::allocator<Point2D>_> *)&local_58,pLVar1,search,sizes);
    move_append((vector<Point2D,_std::allocator<Point2D>_> *)&local_58,__return_storage_ptr__);
  }
  else {
    pLVar1 = (this->childPositive)._M_t.
             super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
             .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl;
    if (pLVar1 == (LazyKdTree<Point2D> *)0x0) goto LAB_00145971;
    in_box((vector<Point2D,_std::allocator<Point2D>_> *)&local_58,pLVar1,search,sizes);
    move_append((vector<Point2D,_std::allocator<Point2D>_> *)&local_58,__return_storage_ptr__);
  }
  std::_Vector_base<Point2D,_std::allocator<Point2D>_>::~_Vector_base(&local_58);
LAB_00145971:
  pdVar4 = Point2D::operator[](search,this->dim);
  dVar5 = *pdVar4;
  pdVar4 = Point2D::operator[](sizes,this->dim);
  local_38 = *pdVar4;
  pdVar4 = Point2D::operator[](search,this->dim);
  local_40 = *pdVar4;
  pdVar4 = Point2D::operator[](sizes,this->dim);
  if (CVar3 == NEGATIVE) {
    if ((this->childPositive)._M_t.
        super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
        .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl ==
        (LazyKdTree<Point2D> *)0x0) {
      return __return_storage_ptr__;
    }
    dVar5 = *pdVar4;
    pdVar4 = Point2D::operator[]((this->data)._M_t.
                                 super___uniq_ptr_impl<Point2D,_std::default_delete<Point2D>_>._M_t.
                                 super__Tuple_impl<0UL,_Point2D_*,_std::default_delete<Point2D>_>.
                                 super__Head_base<0UL,_Point2D_*,_false>._M_head_impl,this->dim);
    if (dVar5 * 0.5 + local_40 < *pdVar4) {
      return __return_storage_ptr__;
    }
    in_box((vector<Point2D,_std::allocator<Point2D>_> *)&local_58,
           (this->childPositive)._M_t.
           super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
           .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl,search,sizes
          );
    move_append((vector<Point2D,_std::allocator<Point2D>_> *)&local_58,__return_storage_ptr__);
  }
  else {
    if (CVar3 != POSITIVE) {
      return __return_storage_ptr__;
    }
    if ((this->childNegative)._M_t.
        super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
        .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl ==
        (LazyKdTree<Point2D> *)0x0) {
      return __return_storage_ptr__;
    }
    pdVar4 = Point2D::operator[]((this->data)._M_t.
                                 super___uniq_ptr_impl<Point2D,_std::default_delete<Point2D>_>._M_t.
                                 super__Tuple_impl<0UL,_Point2D_*,_std::default_delete<Point2D>_>.
                                 super__Head_base<0UL,_Point2D_*,_false>._M_head_impl,this->dim);
    if (*pdVar4 < local_38 * -0.5 + dVar5) {
      return __return_storage_ptr__;
    }
    in_box((vector<Point2D,_std::allocator<Point2D>_> *)&local_58,
           (this->childNegative)._M_t.
           super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
           .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl,search,sizes
          );
    move_append((vector<Point2D,_std::allocator<Point2D>_> *)&local_58,__return_storage_ptr__);
  }
  std::_Vector_base<Point2D,_std::allocator<Point2D>_>::~_Vector_base(&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::vector<P> in_box(P const& search, P const& sizes)
    {
        ensure_evaluated();

        for (size_t i = 0; i < P::dimensions(); ++i) {
            if (sizes[i] <= 0.0)
                return std::vector<P>(); // no real search if one dimension size is <= 0
        }

        std::vector<P> res; // all points within the box

        bool inBox = true;
        for (size_t i = 0; i < P::dimensions() && inBox; ++i)
            inBox = dimension_dist(search, *(data.get()), i) <= 0.5 * sizes[i];

        if (inBox) res.push_back(*(data.get()));

        if (is_leaf()) return res; // no children, return result

        // decide which side to check and recurse into it
        const auto comp = dimension_compare(search, *(data.get()), dim);
        if (comp == NEGATIVE) {
            if (childNegative)
                move_append(childNegative->in_box(search, sizes), res);
        } else if (childPositive) {
            move_append(childPositive->in_box(search, sizes), res);
        }

        const double borderNegative = search[dim] - 0.5 * sizes[dim];
        const double borderPositive = search[dim] + 0.5 * sizes[dim];

        // check whether distances to other side are smaller than radius
        // and recurse into the "wrong" direction, to check for possibly additional
        // candidates
        if (comp == NEGATIVE && childPositive) {
            if (borderPositive >= (*data.get())[dim])
                move_append(childPositive->in_box(search, sizes), res);
        } else if (comp == POSITIVE && childNegative) {
            if (borderNegative <= (*data.get())[dim])
                move_append(childNegative->in_box(search, sizes), res);
        }

        return res;
    }